

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::iterate(AtomicCounterTest *this)

{
  BindingType BVar1;
  OffsetType OVar2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log;
  RenderContext *renderCtx;
  pointer puVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar9;
  undefined4 extraout_var_01;
  ostream *poVar10;
  void *pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__dest;
  TestError *pTVar12;
  Operation OVar13;
  long lVar14;
  uint *puVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  qpTestResult testResult;
  int iVar20;
  char *pcVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counters;
  ScopedLogSection counterSection;
  vector<unsigned_int,_std::allocator<unsigned_int>_> output;
  size_type __dnew;
  vector<unsigned_int,_std::allocator<unsigned_int>_> gets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  Buffer outputBuffer;
  Buffer counterBuffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> decrements;
  ShaderProgram program;
  int local_468;
  int local_450;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_438;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_418;
  undefined1 local_400 [16];
  pointer local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b8;
  undefined1 local_398 [8];
  iterator iStack_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388 [6];
  ios_base local_328 [8];
  ios_base local_320 [272];
  ulong local_210;
  ObjectWrapper local_208;
  ObjectWrapper local_1f0;
  undefined1 local_1d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_148;
  undefined1 local_128 [40];
  ShaderProgram local_100;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar23 = CONCAT44(extraout_var,iVar7);
  log = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_1f0,(Functions *)CONCAT44(extraout_var_00,iVar7),pOVar9);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_208,(Functions *)CONCAT44(extraout_var_01,iVar7),pOVar9);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1d8,0,0xac);
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_398,
             "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
  BVar1 = (this->m_spec).bindingType;
  if (BVar1 == BINDINGTYPE_INVALID_DEFAULT) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,"layout(binding=10000",0x14);
  }
  OVar2 = (this->m_spec).offsetType;
  if (OVar2 == OFFSETTYPE_INVALID_DEFAULT) {
    pcVar21 = "layout(binding=1, ";
    if (BVar1 == BINDINGTYPE_INVALID_DEFAULT) {
      pcVar21 = ", ";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,pcVar21,(ulong)(BVar1 != BINDINGTYPE_INVALID_DEFAULT) << 4 | 2);
    pcVar21 = "offset=1";
LAB_01437351:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,pcVar21,8);
LAB_0143736a:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,") uniform atomic_uint;\n",0x17);
  }
  else {
    if (OVar2 == OFFSETTYPE_RESET_DEFAULT) {
      pcVar21 = "layout(binding=1, ";
      if (BVar1 == BINDINGTYPE_INVALID_DEFAULT) {
        pcVar21 = ", ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_398,pcVar21,(ulong)(BVar1 != BINDINGTYPE_INVALID_DEFAULT) << 4 | 2
                );
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"offset=",7);
      std::ostream::operator<<(local_398,((this->m_spec).atomicCounterCount << 2) >> 1);
      goto LAB_0143736a;
    }
    if (OVar2 == OFFSETTYPE_DEFAULT_AUTO) {
      pcVar21 = "layout(binding=1, ";
      if (BVar1 == BINDINGTYPE_INVALID_DEFAULT) {
        pcVar21 = ", ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_398,pcVar21,(ulong)(BVar1 != BINDINGTYPE_INVALID_DEFAULT) << 4 | 2
                );
      pcVar21 = "offset=4";
      goto LAB_01437351;
    }
    if (BVar1 == BINDINGTYPE_INVALID_DEFAULT) goto LAB_0143736a;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_398,"layout(binding = 1, std430) buffer Output {\n",0x2c);
  OVar13 = (this->m_spec).operations;
  if (OVar13 != OPERATION_GET && (OVar13 & OPERATION_GET) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\tuint preGet[",0xd);
    poVar10 = (ostream *)
              std::ostream::operator<<
                        (local_398,
                         (this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                         (this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n",3);
    OVar13 = (this->m_spec).operations;
  }
  if ((OVar13 & OPERATION_INC) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,"\tuint increment[",0x10);
    poVar10 = (ostream *)
              std::ostream::operator<<
                        (local_398,
                         (this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                         (this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n",3);
    OVar13 = (this->m_spec).operations;
  }
  if ((OVar13 & OPERATION_DEC) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,"\tuint decrement[",0x10);
    poVar10 = (ostream *)
              std::ostream::operator<<
                        (local_398,
                         (this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                         (this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n",3);
    OVar13 = (this->m_spec).operations;
  }
  if (OVar13 != OPERATION_GET && (OVar13 & OPERATION_GET) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\tuint postGet[",0xe);
    poVar10 = (ostream *)
              std::ostream::operator<<
                        (local_398,
                         (this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                         (this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n",3);
    OVar13 = (this->m_spec).operations;
  }
  if (OVar13 == OPERATION_GET) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\tuint get[",10);
    poVar10 = (ostream *)
              std::ostream::operator<<
                        (local_398,
                         (this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                         (this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"} sb_in;\n\n",10);
  iVar7 = (this->m_spec).atomicCounterCount;
  if (0 < iVar7) {
    iVar18 = 0;
    iVar26 = 1;
    local_450 = -1;
    uVar22 = 0;
    do {
      if ((uVar22 == iVar7 / 2) && ((this->m_spec).offsetType == OFFSETTYPE_RESET_DEFAULT)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,"layout(binding=1, offset=0) uniform atomic_uint;\n",0x31);
      }
      BVar1 = (this->m_spec).bindingType;
      if (BVar1 == BINDINGTYPE_BASIC) {
        lVar14 = 0x10;
        pcVar21 = "layout(binding=1";
LAB_014375ec:
        bVar16 = 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,pcVar21,lVar14);
      }
      else {
        if (BVar1 == BINDINGTYPE_INVALID) {
          lVar14 = 0x14;
          pcVar21 = "layout(binding=10000";
          goto LAB_014375ec;
        }
        bVar16 = 0;
      }
      uVar24 = uVar22;
      switch((this->m_spec).offsetType) {
      case OFFSETTYPE_NONE:
      case OFFSETTYPE_INVALID_DEFAULT:
        lVar14 = 0x1b;
        pcVar21 = "uniform atomic_uint counter";
        if (bVar16 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,") ",2);
          pcVar21 = "uniform atomic_uint counter";
        }
        goto LAB_01437935;
      case OFFSETTYPE_BASIC:
        pcVar21 = "layout(";
        if (bVar16 != 0) {
          pcVar21 = ", ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,pcVar21,(ulong)(bVar16 ^ 1) * 5 + 2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"offset=",7);
        poVar10 = (ostream *)std::ostream::operator<<(local_398,iVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,") uniform atomic_uint counter",0x1d);
        break;
      case OFFSETTYPE_REVERSE:
        pcVar21 = "layout(";
        if (bVar16 != 0) {
          pcVar21 = ", ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,pcVar21,(ulong)(bVar16 ^ 1) * 5 + 2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"offset=",7);
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            (local_398,((this->m_spec).atomicCounterCount + local_450) * 4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,") uniform atomic_uint counter",0x1d);
        uVar24 = ~uVar22 + (this->m_spec).atomicCounterCount;
        break;
      case OFFSETTYPE_FIRST_AUTO:
        if (uVar22 + 1 == (this->m_spec).atomicCounterCount) {
LAB_01437736:
          pcVar21 = "layout(";
          if (bVar16 != 0) {
            pcVar21 = ", ";
          }
          lVar14 = 0x28;
          poVar10 = (ostream *)local_398;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,pcVar21,(ulong)(bVar16 ^ 1) * 5 + 2);
          pcVar21 = "offset=0) uniform atomic_uint counter0;\n";
        }
        else {
          if (uVar22 != 0) {
            if (bVar16 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,") ",2);
            }
            poVar10 = (ostream *)local_398;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"uniform atomic_uint counter",0x1b);
            uVar24 = uVar22 + 1;
            break;
          }
          pcVar21 = "layout(";
          if (bVar16 != 0) {
            pcVar21 = ", ";
          }
          lVar14 = 0x28;
          poVar10 = (ostream *)local_398;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,pcVar21,(ulong)(bVar16 ^ 1) * 5 + 2);
          pcVar21 = "offset=4) uniform atomic_uint counter1;\n";
        }
        goto LAB_014379d8;
      case OFFSETTYPE_DEFAULT_AUTO:
        if (uVar22 + 1 == (this->m_spec).atomicCounterCount) goto LAB_01437736;
        if (bVar16 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,") ",2);
        }
        poVar10 = (ostream *)local_398;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"uniform atomic_uint counter",0x1b);
        uVar24 = uVar22 + 1;
        break;
      case OFFSETTYPE_RESET_DEFAULT:
        if (bVar16 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,") ",2);
        }
        if ((int)uVar22 < (this->m_spec).atomicCounterCount / 2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"uniform atomic_uint counter",0x1b);
          iVar7 = (this->m_spec).atomicCounterCount / 2;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"uniform atomic_uint counter",0x1b);
          iVar7 = -((this->m_spec).atomicCounterCount / 2);
        }
        poVar10 = (ostream *)local_398;
        uVar24 = iVar7 + uVar22;
        break;
      case OFFSETTYPE_INVALID:
        pcVar21 = "layout(";
        if (bVar16 != 0) {
          pcVar21 = ", ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,pcVar21,(ulong)(bVar16 ^ 1) * 5 + 2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"offset=",7);
        poVar10 = (ostream *)std::ostream::operator<<(local_398,iVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,") uniform atomic_uint counter",0x1d);
        break;
      case OFFSETTYPE_INVALID_OVERLAPPING:
        pcVar21 = "layout(";
        if (bVar16 != 0) {
          pcVar21 = ", ";
        }
        lVar14 = 0x25;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,pcVar21,(ulong)(bVar16 ^ 1) * 5 + 2);
        pcVar21 = "offset=0) uniform atomic_uint counter";
LAB_01437935:
        poVar10 = (ostream *)local_398;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar21,lVar14);
        break;
      default:
        goto switchD_01437622_default;
      }
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar24);
      lVar14 = 2;
      pcVar21 = ";\n";
LAB_014379d8:
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar21,lVar14);
switchD_01437622_default:
      uVar22 = uVar22 + 1;
      iVar7 = (this->m_spec).atomicCounterCount;
      iVar18 = iVar18 + 4;
      iVar26 = iVar26 + 2;
      local_450 = local_450 + -1;
    } while ((int)uVar22 < iVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"{\n",2);
  if (1 < (this->m_spec).callCount) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_398,"\tfor (uint i = 0u; i < ",0x17);
    poVar10 = (ostream *)std::ostream::operator<<(local_398,(this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u; i++)\n",8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_398,"\t\tuint id = (gl_GlobalInvocationID.x",0x24);
  if ((this->m_spec).callCount < 2) {
LAB_01437b6e:
    lVar14 = 1;
    pcVar21 = ")";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398," * ",3);
    poVar10 = (ostream *)std::ostream::operator<<(local_398,(this->m_spec).callCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u",1);
    if ((this->m_spec).callCount < 2) goto LAB_01437b6e;
    lVar14 = 5;
    pcVar21 = " + i)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,pcVar21,lVar14);
  if (1 < (this->m_spec).atomicCounterCount) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398," * ",3);
    poVar10 = (ostream *)std::ostream::operator<<(local_398,(this->m_spec).atomicCounterCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,";\n",2);
  if (0 < (this->m_spec).atomicCounterCount) {
    iVar7 = 0;
    do {
      OVar13 = (this->m_spec).operations;
      if (OVar13 != OPERATION_GET && (OVar13 & OPERATION_GET) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,"\t\tsb_in.preGet[id + ",0x14);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"u] = atomicCounter(counter",0x1a);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
        OVar13 = (this->m_spec).operations;
      }
      if ((this->m_spec).useBranches == true) {
        if ((~OVar13 & 3) != 0) {
          if ((OVar13 & OPERATION_INC) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\tif (((gl_GlobalInvocationID.x",0x1f);
            iVar18 = (this->m_spec).callCount;
            pcVar21 = ::glcts::fixed_sample_locations_values + 1;
            if (1 < iVar18) {
              pcVar21 = " + i";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,pcVar21,(ulong)(1 < iVar18) << 2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,") % 2u) == 0u)\n",0xf);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t\t{\n",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\t\tsb_in.increment[id + ",0x18);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"u] = atomicCounterIncrement(counter",0x23);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t}\n",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\telse\n",7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t{\n",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"\t\t\tsb_in.increment[id + ",0x18);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
            lVar14 = 4;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u] = uint(-1);\n",0xf);
            pcVar21 = "\t\t}\n";
            goto LAB_01437fd6;
          }
          goto LAB_01437fe4;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,"\t\tif (((gl_GlobalInvocationID.x",0x1f);
        iVar18 = (this->m_spec).callCount;
        pcVar21 = ::glcts::fixed_sample_locations_values + 1;
        if (1 < iVar18) {
          pcVar21 = " + i";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,pcVar21,(ulong)(1 < iVar18) << 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,") % 2u) == 0u)\n",0xf);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t\t{\n",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,"\t\t\tsb_in.increment[id + ",0x18);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"u] = atomicCounterIncrement(counter",0x23);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"\t\t\tsb_in.decrement[id + ",0x18);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u] = uint(-1);\n",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t}\n",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\telse\n",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t{\n",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"\t\t\tsb_in.decrement[id + ",0x18);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"u] = atomicCounterDecrement(counter",0x23);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") + 1u;\n",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"\t\t\tsb_in.increment[id + ",0x18);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
        lVar14 = 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u] = uint(-1);\n",0xf);
        pcVar21 = "\t\t}\n";
LAB_01438183:
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar21,lVar14);
        OVar13 = (this->m_spec).operations;
      }
      else {
        if ((OVar13 & OPERATION_INC) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"\t\tsb_in.increment[id + ",0x17);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"u] = atomicCounterIncrement(counter",0x23);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
          lVar14 = 3;
          pcVar21 = ");\n";
LAB_01437fd6:
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar21,lVar14);
          OVar13 = (this->m_spec).operations;
        }
LAB_01437fe4:
        if ((OVar13 & OPERATION_DEC) != 0) {
          if ((this->m_spec).useBranches == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\tif (((gl_GlobalInvocationID.x",0x1f);
            iVar18 = (this->m_spec).callCount;
            pcVar21 = ::glcts::fixed_sample_locations_values + 1;
            if (1 < iVar18) {
              pcVar21 = " + i";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,pcVar21,(ulong)(1 < iVar18) << 2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,") % 2u) == 0u)\n",0xf);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t\t{\n",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\t\tsb_in.decrement[id + ",0x18);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"u] = atomicCounterDecrement(counter",0x23);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,") + 1u;\n",8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t}\n",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\telse\n",7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t{\n",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"\t\t\tsb_in.decrement[id + ",0x18);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
            lVar14 = 4;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u] = uint(-1);\n",0xf);
            pcVar21 = "\t\t}\n";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_398,"\t\tsb_in.decrement[id + ",0x17);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"u] = atomicCounterDecrement(counter",0x23);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
            lVar14 = 8;
            pcVar21 = ") + 1u;\n";
          }
          goto LAB_01438183;
        }
      }
      if (OVar13 != OPERATION_GET && (OVar13 & OPERATION_GET) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_398,"\t\tsb_in.postGet[id + ",0x15);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"u] = atomicCounter(counter",0x1a);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
        OVar13 = (this->m_spec).operations;
      }
      if (OVar13 == OPERATION_GET) {
        if ((this->m_spec).useBranches == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"\t\tif (((gl_GlobalInvocationID.x",0x1f);
          iVar18 = (this->m_spec).callCount;
          pcVar21 = ::glcts::fixed_sample_locations_values + 1;
          if (1 < iVar18) {
            pcVar21 = " + i";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,pcVar21,(ulong)(1 < iVar18) << 2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,") % 2u) == 0u)\n",0xf);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t\t{\n",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"\t\t\tsb_in.get[id + ",0x12);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"u] = atomicCounter(counter",0x1a);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t}\n",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\telse\n",7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t{\n",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t\tsb_in.get[id + ",0x12);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
          lVar14 = 4;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u] = uint(-1);\n",0xf);
          pcVar21 = "\t\t}\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_398,"\t\tsb_in.get[id + ",0x11);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_398,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"u] = atomicCounter(counter",0x1a);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
          lVar14 = 3;
          pcVar21 = ");\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar21,lVar14);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < (this->m_spec).atomicCounterCount);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
  std::ios_base::~ios_base(local_328);
  local_400._0_4_ = 5;
  local_400._8_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_400 + 8),
             local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish +
             (long)local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + (ulong)(uint)local_400._0_4_ * 0x18),(value_type *)(local_400 + 8));
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._8_8_ != &local_3e8) {
    operator_delete((void *)local_400._8_8_,local_3e8._M_allocated_capacity + 1);
  }
  if ((pointer *)
      local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  OVar13 = (this->m_spec).operations;
  iVar7 = 1;
  if (OVar13 != OPERATION_GET) {
    iVar7 = (OVar13 >> 1 & 2) + (OVar13 & OPERATION_INC) + (uint)((OVar13 >> 1 & 1) != 0);
  }
  iVar18 = (this->m_spec).atomicCounterCount;
  iVar26 = (this->m_spec).callCount;
  iVar3 = (this->m_spec).threadCount;
  glu::operator<<((TestLog *)&log->_M_allocated_capacity,&local_100);
  OVar2 = (this->m_spec).offsetType;
  if ((((OVar2 == OFFSETTYPE_INVALID) || (OVar2 == OFFSETTYPE_INVALID_DEFAULT)) ||
      (OVar2 == OFFSETTYPE_INVALID_OVERLAPPING)) ||
     ((this->m_spec).bindingType - BINDINGTYPE_INVALID < 2)) {
    if (local_100.m_program.m_info.linkOk == true) {
      local_398 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_390);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&iStack_390,"Expected program to fail, but compilation passed.",0x31);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_390);
      std::ios_base::~ios_base(local_320);
      pcVar21 = "Compile succeeded";
      goto LAB_014385b6;
    }
    local_398 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_390);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&iStack_390,"Compilation failed as expected.",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_390);
    std::ios_base::~ios_base(local_320);
    pcVar21 = "Compile failed";
    testResult = QP_TEST_RESULT_PASS;
LAB_0143861b:
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar21);
    goto LAB_01438624;
  }
  if (local_100.m_program.m_info.linkOk == false) {
    local_398 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_390);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&iStack_390,"Compile failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_390);
    std::ios_base::~ios_base(local_320);
    pcVar21 = "Compile failed";
LAB_014385b6:
    testResult = QP_TEST_RESULT_FAIL;
    goto LAB_0143861b;
  }
  (**(code **)(lVar23 + 0x1680))(local_100.m_program.m_program);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"glUseProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3b7);
  (**(code **)(lVar23 + 0x40))(0x90d2,local_208.m_object);
  iVar18 = iVar18 * 4;
  iVar7 = iVar3 * iVar7 * iVar26 * iVar18;
  (**(code **)(lVar23 + 0x150))(0x90d2,(long)iVar7,0,0x88e4);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"Failed to create output buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3bc);
  local_1d8._0_4_ = (this->m_spec).threadCount * (this->m_spec).callCount + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
             (long)(this->m_spec).atomicCounterCount,(value_type_conflict4 *)local_1d8,
             (allocator_type *)local_400);
  (**(code **)(lVar23 + 0x40))(0x90d2,local_1f0.m_object);
  (**(code **)(lVar23 + 0x150))(0x90d2,(long)iVar18,local_398,0x88e4);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"Failed to create buffer for atomic counters",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3c3);
  if (local_398 != (undefined1  [8])0x0) {
    operator_delete((void *)local_398,local_388[0]._M_allocated_capacity - (long)local_398);
  }
  (**(code **)(lVar23 + 0x48))(0x90d2,1,local_208.m_object);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"Failed to setup output buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3c8);
  (**(code **)(lVar23 + 0x48))(0x92c0,1,local_1f0.m_object);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"Failed to setup atomic counter buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3cc);
  (**(code **)(lVar23 + 0x528))((this->m_spec).threadCount,1,1);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3d0);
  (**(code **)(lVar23 + 0x648))();
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"glFinish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3d3);
  local_398._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_400,(long)(iVar7 >> 2),
             (value_type_conflict4 *)local_398,(allocator_type *)local_1d8);
  local_398 = (undefined1  [8])((ulong)(uint)local_398._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_438,(long)(this->m_spec).atomicCounterCount,(value_type_conflict4 *)local_398,
             (allocator_type *)local_1d8);
  (**(code **)(lVar23 + 0x40))(0x90d2,local_208.m_object);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3db);
  pvVar11 = (void *)(**(code **)(lVar23 + 0xd00))
                              (0x90d2,0,local_400._8_8_ - CONCAT44(local_400._4_4_,local_400._0_4_),
                               1);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3de);
  memcpy((void *)CONCAT44(local_400._4_4_,local_400._0_4_),pvVar11,
         (local_400._8_8_ - (long)CONCAT44(local_400._4_4_,local_400._0_4_)) * 0x40000000 >> 0x1e);
  cVar5 = (**(code **)(lVar23 + 0x1670))(0x90d2);
  if (cVar5 == '\0') {
    dVar8 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar8,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                    ,0x3e4);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Mapped buffer corrupted","false",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
               ,0x3e5);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar23 + 0x40))(0x90d2,0);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3e9);
  (**(code **)(lVar23 + 0x40))(0x90d2,local_1f0.m_object);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3ef);
  pvVar11 = (void *)(**(code **)(lVar23 + 0xd00))
                              (0x90d2,0,(long)local_438.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_438.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start,1);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3f2);
  memcpy(local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,pvVar11,
         ((long)local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start) * 0x40000000 >> 0x1e);
  cVar5 = (**(code **)(lVar23 + 0x1670))(0x90d2);
  if (cVar5 == '\0') {
    dVar8 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar8,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                    ,0x3f8);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Mapped buffer corrupted","false",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
               ,0x3f9);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar23 + 0x40))(0x90d2,0);
  dVar8 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar8,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3fd);
  local_388[0]._M_allocated_capacity = (pointer)0x207265746e756f43;
  local_388[0]._8_4_ = 0x6f666e69;
  iStack_390._M_current = (uint *)0xc;
  local_388[0]._M_local_buf[0xc] = '\0';
  local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x45;
  local_398 = (undefined1  [8])local_388;
  local_1d8._0_8_ = local_1c8;
  __dest = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::_M_create((ulong *)local_1d8,(ulong)&local_3d8);
  puVar4 = local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1c8[0]._M_dataplus._M_p =
       (pointer)local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1d8._0_8_ = __dest;
  memcpy(__dest,"Show initial value, current value and expected value of each counter.",0x45);
  local_1d8._8_8_ = puVar4;
  *(undefined1 *)((long)&(__dest->_M_dataplus)._M_p + (long)puVar4) = 0;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_418,(TestLog *)&log->_M_allocated_capacity,
             (string *)local_398,(string *)local_1d8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_ !=
      local_1c8) {
    operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_dataplus._M_p + 1));
  }
  if (local_398 != (undefined1  [8])local_388) {
    operator_delete((void *)local_398,local_388[0]._M_allocated_capacity + 1);
  }
  if (0 < (int)((ulong)((long)local_438.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_438.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    bVar16 = 1;
    lVar23 = 0;
    uVar24 = *local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar7 = (this->m_spec).threadCount * (this->m_spec).callCount;
    uVar22 = iVar7 + 1;
    OVar13 = (this->m_spec).operations & (OPERATION_DEC|OPERATION_INC);
    uVar17 = 0xffffffff;
    switch(OVar13) {
    case OPERATION_INC:
      goto switchD_01438c32_caseD_1;
    case OPERATION_DEC:
      goto switchD_01438c32_caseD_2;
    case OPERATION_DEC|OPERATION_INC:
      goto switchD_01438c32_caseD_3;
    }
switchD_01438c32_caseD_0:
    if (OVar13 == 0) {
      uVar17 = uVar22;
    }
    do {
      local_398 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_390);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&iStack_390,"atomic_uint counter",0x13);
      std::ostream::operator<<((ostringstream *)&iStack_390,(int)lVar23);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&iStack_390," initial value: ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)&iStack_390);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&iStack_390,", value: ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)&iStack_390);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&iStack_390,", expected: ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)&iStack_390);
      pcVar21 = ", failed!";
      if (uVar24 == uVar17) {
        pcVar21 = ::glcts::fixed_sample_locations_values + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&iStack_390,pcVar21,(ulong)(uVar24 != uVar17) * 9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_390);
      std::ios_base::~ios_base(local_320);
      bVar16 = uVar24 == uVar17 & bVar16;
      lVar23 = lVar23 + 1;
      if ((int)((ulong)((long)local_438.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_438.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2) <= lVar23) goto LAB_01438ef0;
      uVar24 = local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar23];
      iVar7 = (this->m_spec).threadCount * (this->m_spec).callCount;
      uVar22 = iVar7 + 1;
      OVar13 = (this->m_spec).operations & (OPERATION_DEC|OPERATION_INC);
      uVar17 = 0xffffffff;
      switch(OVar13) {
      case 0:
        goto switchD_01438c32_caseD_0;
      case OPERATION_INC:
        goto switchD_01438c32_caseD_1;
      case OPERATION_DEC:
        goto switchD_01438c32_caseD_2;
      case OPERATION_DEC|OPERATION_INC:
switchD_01438c32_caseD_3:
        iVar18 = 0;
        if ((this->m_spec).useBranches == true) {
          iVar18 = -(iVar7 / 2);
          uVar22 = (iVar7 - iVar7 / 2) + uVar22;
        }
        uVar17 = uVar22 + iVar18;
      }
    } while( true );
  }
  bVar16 = 1;
LAB_01438ef0:
  tcu::TestLog::endSection
            ((TestLog *)
             local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_388[0]._M_allocated_capacity = (uint *)0x0;
  local_398 = (undefined1  [8])0x0;
  iStack_390._M_current = (uint *)0x0;
  local_1c8[0]._M_dataplus._M_p = (pointer)0x0;
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8._8_8_ = (pointer)0x0;
  local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  iVar25 = 0;
  local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  iVar7 = (this->m_spec).callCount;
  iVar18 = (this->m_spec).threadCount;
  iVar26 = (this->m_spec).atomicCounterCount;
  OVar13 = (this->m_spec).operations;
  bVar6 = true;
  iVar3 = -1;
  local_450 = -1;
  if ((OVar13 == OPERATION_GET) || (6 < OVar13 - OPERATION_INC)) goto switchD_014392b2_caseD_4;
  iVar20 = iVar18 * iVar7 * iVar26;
  switch(OVar13) {
  case OPERATION_INC:
    iVar19 = -1;
    bVar6 = true;
    break;
  case OPERATION_DEC:
    iVar3 = 0;
  case OPERATION_GET:
switchD_014392b2_caseD_4:
    iVar19 = -1;
    iVar25 = -1;
    local_450 = iVar3;
    break;
  case OPERATION_DEC|OPERATION_INC:
    iVar19 = -1;
    local_450 = iVar20;
    break;
  case OPERATION_GET|OPERATION_INC:
    iVar19 = iVar20 * 2;
    goto LAB_014392e3;
  case OPERATION_GET|OPERATION_DEC:
    iVar19 = iVar20 * 2;
    bVar6 = false;
    iVar25 = -1;
    local_450 = iVar20;
    break;
  case OPERATION_GET|OPERATION_DEC|OPERATION_INC:
    iVar3 = iVar20 * 2;
    iVar19 = iVar20 * 3;
LAB_014392e3:
    iVar25 = iVar20;
    local_450 = iVar3;
    bVar6 = false;
  }
  if (0 < iVar18) {
    local_468 = 0;
    local_210 = (ulong)OVar13;
    do {
      if (0 < iVar7) {
        iVar18 = 0;
        do {
          if (0 < iVar26) {
            iVar7 = 0;
            do {
              iVar26 = ((this->m_spec).callCount * local_468 + iVar18) * iVar26;
              if (iVar25 != -1) {
                puVar15 = (uint *)((long)(iVar7 + iVar25 + iVar26) * 4 +
                                  CONCAT44(local_400._4_4_,local_400._0_4_));
                if (iStack_390._M_current == (uint *)local_388[0]._0_8_) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_398,
                             iStack_390,puVar15);
                }
                else {
                  *iStack_390._M_current = *puVar15;
                  iStack_390._M_current = iStack_390._M_current + 1;
                }
              }
              if (local_450 != -1) {
                puVar15 = (uint *)((long)(local_450 + iVar7 + iVar26) * 4 +
                                  CONCAT44(local_400._4_4_,local_400._0_4_));
                if ((pointer)local_1d8._8_8_ == local_1c8[0]._M_dataplus._M_p) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1d8,
                             (iterator)local_1d8._8_8_,puVar15);
                }
                else {
                  *(uint *)local_1d8._8_8_ = *puVar15;
                  local_1d8._8_8_ = local_1d8._8_8_ + 4;
                }
              }
              if (!bVar6) {
                puVar15 = (uint *)((long)(iVar7 + iVar26) * 4 +
                                  CONCAT44(local_400._4_4_,local_400._0_4_));
                if (local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_3d8,
                             (iterator)
                             local_3d8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,puVar15);
                }
                else {
                  *local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish = *puVar15;
                  local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              if (iVar19 != -1) {
                puVar15 = (uint *)((long)(iVar26 + iVar19 + iVar7) * 4 +
                                  CONCAT44(local_400._4_4_,local_400._0_4_));
                if (local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_418,
                             (iterator)
                             local_418.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,puVar15);
                }
                else {
                  *local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish = *puVar15;
                  local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              if ((int)local_210 == 4) {
                puVar15 = (uint *)((long)(iVar7 + iVar26) * 4 +
                                  CONCAT44(local_400._4_4_,local_400._0_4_));
                if (local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_3b8,
                             (iterator)
                             local_3b8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,puVar15);
                }
                else {
                  *local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish = *puVar15;
                  local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              iVar7 = iVar7 + 1;
              iVar26 = (this->m_spec).atomicCounterCount;
            } while (iVar7 < iVar26);
            iVar7 = (this->m_spec).callCount;
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 < iVar7);
        iVar18 = (this->m_spec).threadCount;
      }
      local_468 = local_468 + 1;
    } while (local_468 < iVar18);
  }
  bVar6 = checkAndLogCallValues
                    (this,(TestLog *)&log->_M_allocated_capacity,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_3d8,
                     &local_418,&local_3b8);
  if (local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((TestLog *)
      local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._0_8_,(long)local_1c8[0]._M_dataplus._M_p - local_1d8._0_8_);
  }
  if (local_398 != (undefined1  [8])0x0) {
    operator_delete((void *)local_398,local_388[0]._M_allocated_capacity - (long)local_398);
  }
  pcVar21 = "Fail";
  if ((bVar6 & bVar16) != 0) {
    pcVar21 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(byte)(bVar6 & bVar16 ^ 1),pcVar21);
  if (local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pvVar11 = (void *)CONCAT44(local_400._4_4_,local_400._0_4_);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_3f0 - (long)pvVar11);
  }
LAB_01438624:
  glu::ShaderProgram::~ShaderProgram(&local_100);
  glu::ObjectWrapper::~ObjectWrapper(&local_208);
  glu::ObjectWrapper::~ObjectWrapper(&local_1f0);
  return STOP;
switchD_01438c32_caseD_2:
  if ((this->m_spec).useBranches == true) {
    iVar7 = iVar7 - iVar7 / 2;
  }
  uVar17 = uVar22 - iVar7;
  goto switchD_01438c32_caseD_0;
switchD_01438c32_caseD_1:
  if ((this->m_spec).useBranches == true) {
    iVar7 = iVar7 - iVar7 / 2;
  }
  uVar17 = iVar7 + uVar22;
  goto switchD_01438c32_caseD_0;
}

Assistant:

TestCase::IterateResult AtomicCounterTest::iterate (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	TestLog&					log					= m_testCtx.getLog();
	const glu::Buffer			counterBuffer		(m_context.getRenderContext());
	const glu::Buffer			outputBuffer		(m_context.getRenderContext());
	const glu::ShaderProgram	program				(m_context.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(glu::SHADERTYPE_COMPUTE, generateShaderSource(m_spec)));

	const deInt32				counterBufferSize	= m_spec.atomicCounterCount * 4;
	const deInt32				ssoSize				= m_spec.atomicCounterCount * m_spec.callCount * m_spec.threadCount * 4 * getOperationCount();

	log << program;

	if (m_spec.offsetType == OFFSETTYPE_INVALID || m_spec.offsetType == OFFSETTYPE_INVALID_DEFAULT || m_spec.bindingType == BINDINGTYPE_INVALID || m_spec.bindingType == BINDINGTYPE_INVALID_DEFAULT || m_spec.offsetType == OFFSETTYPE_INVALID_OVERLAPPING)
	{
		if (program.isOk())
		{
			log << TestLog::Message << "Expected program to fail, but compilation passed." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile succeeded");
			return STOP;
		}
		else
		{
			log << TestLog::Message << "Compilation failed as expected." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Compile failed");
			return STOP;
		}
	}
	else if (!program.isOk())
	{
		log << TestLog::Message << "Compile failed." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	gl.useProgram(program.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram()");

	// Create output buffer
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, ssoSize, NULL, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create output buffer");

	// Create atomic counter buffer
	{
		vector<deUint32> data(m_spec.atomicCounterCount, getInitialValue());
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *counterBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, counterBufferSize, &(data[0]), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create buffer for atomic counters");
	}

	// Bind output buffer
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *outputBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup output buffer");

	// Bind atomic counter buffer
	gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, *counterBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup atomic counter buffer");

	// Dispath compute
	gl.dispatchCompute(m_spec.threadCount, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

	gl.finish();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

	vector<deUint32> output(ssoSize/4, 0);
	vector<deUint32> counters(m_spec.atomicCounterCount, 0);

	// Read back output buffer
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		void* ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(output.size() * sizeof(deUint32)), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");

		deMemcpy(&(output[0]), ptr, (int)output.size() * sizeof(deUint32));

		if (!gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER))
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
			TCU_CHECK_MSG(false, "Mapped buffer corrupted");
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
	}

	// Read back counter buffer
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *counterBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		void* ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(counters.size() * sizeof(deUint32)), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");

		deMemcpy(&(counters[0]), ptr, (int)counters.size() * sizeof(deUint32));

		if (!gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER))
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
			TCU_CHECK_MSG(false, "Mapped buffer corrupted");
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
	}

	bool isOk = true;

	if (!checkAndLogCounterValues(log, counters))
		isOk = false;

	{
		vector<deUint32> increments;
		vector<deUint32> decrements;
		vector<deUint32> preGets;
		vector<deUint32> postGets;
		vector<deUint32> gets;

		splitBuffer(output, increments, decrements, preGets, postGets, gets);

		if (!checkAndLogCallValues(log, increments, decrements, preGets, postGets, gets))
			isOk = false;
	}

	if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}